

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O0

void generate_tree_rules(vector<IsoTree,_std::allocator<IsoTree>_> *trees,
                        vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,bool output_score,
                        size_t curr_ix,bool index1,string *prev_cond,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *node_rules,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_left,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_right,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext)

{
  byte bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_type in_RCX;
  byte in_DL;
  byte bVar4;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RSI;
  vector<IsoTree,_std::allocator<IsoTree>_> *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  IsoForest *in_stack_00000018;
  ExtIsoForest *in_stack_00000020;
  long in_stack_00000028;
  string cond_right;
  string cond_left;
  value_type *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  IsoForest *__lhs;
  char *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [48];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  undefined1 index1_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 output_score_00;
  undefined7 in_stack_ffffffffffffffd8;
  
  index1_00 = (undefined1)((ulong)in_R9 >> 0x38);
  bVar4 = in_DL & 1;
  bVar1 = in_R8B & 1;
  if (((in_RDI == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) ||
      (pvVar2 = std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,in_RCX),
      pvVar2->tree_left != 0)) &&
     ((in_RSI == (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0 ||
      (pvVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RSI,in_RCX),
      pvVar3->hplane_left != 0)))) {
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_00000010,in_RCX);
    std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_190);
    if (in_RDI == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RSI,in_RCX);
    }
    else {
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,in_RCX);
    }
    __rhs = in_stack_00000010;
    __lhs = in_stack_00000018;
    generate_tree_rules((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                        (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                        CONCAT17(bVar4,in_stack_ffffffffffffffd8),SUB81(in_RCX >> 0x38,0),
                        CONCAT17(bVar1,in_stack_ffffffffffffffc8),(bool)index1_00,
                        in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_00000010,in_stack_00000018,in_stack_00000020);
    std::__cxx11::string::clear();
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_00000018,in_RCX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1f0);
    if (in_RDI == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RSI,in_RCX);
      output_score_00 = (undefined1)(in_RCX >> 0x38);
    }
    else {
      std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,in_RCX);
      output_score_00 = (undefined1)(in_RCX >> 0x38);
    }
    generate_tree_rules((vector<IsoTree,_std::allocator<IsoTree>_> *)in_RSI,
                        (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                        CONCAT17(bVar4,in_stack_ffffffffffffffd8),(bool)output_score_00,
                        CONCAT17(bVar1,in_stack_ffffffffffffffc8),(bool)index1_00,
                        in_stack_ffffffffffffffb8,unaff_retaddr,in_stack_00000008,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_00000010,in_stack_00000018,in_stack_00000020);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_150);
  }
  else {
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    if ((bVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(in_stack_00000008);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
    }
    else {
      if (in_RDI == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
        if ((*(int *)(in_stack_00000028 + 0x24) == 0x5c) ||
           (*(int *)(in_stack_00000028 + 0x24) == 0x5f)) {
          std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RSI,in_RCX);
        }
        else {
          std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RSI,in_RCX);
        }
      }
      else if ((in_stack_00000020->scoring_metric == Density) ||
              (in_stack_00000020->scoring_metric == BoxedRatio)) {
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,in_RCX);
      }
      else {
        std::vector<IsoTree,_std::allocator<IsoTree>_>::operator[](in_RDI,in_RCX);
      }
      std::__cxx11::to_string((double)in_stack_fffffffffffffd68);
    }
    std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(in_stack_00000008);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd98);
    std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_e0);
  }
  return;
}

Assistant:

void generate_tree_rules(const std::vector<IsoTree> *trees, const std::vector<IsoHPlane> *hplanes, const bool output_score,
                         const size_t curr_ix, const bool index1, const std::string &prev_cond,
                         std::vector<std::string> &node_rules,
                         std::vector<std::string> &conditions_left, std::vector<std::string> &conditions_right,
                         const IsoForest *model_outputs, const ExtIsoForest *model_outputs_ext)
{
    // if ((trees != NULL && (*trees)[curr_ix].score >= 0) ||
    //     (hplanes != NULL && (*hplanes)[curr_ix].score >= 0))
    if ((trees != NULL && (*trees)[curr_ix].tree_left == 0) ||
        (hplanes != NULL && (*hplanes)[curr_ix].hplane_left == 0))
    {
        node_rules.push_back(prev_cond
                                + "\tTHEN "
                                + (output_score?
                                    (std::to_string((trees != NULL)?
                                        ((model_outputs->scoring_metric != Density && model_outputs->scoring_metric != BoxedRatio)?
                                            (*trees)[curr_ix].score : (-(*trees)[curr_ix].score))
                                            :
                                        ((model_outputs_ext->scoring_metric != Density && model_outputs_ext->scoring_metric != BoxedRatio)?
                                            (*hplanes)[curr_ix].score : (-(*hplanes)[curr_ix].score))))
                                        :
                                    (std::to_string(node_rules.size() + (size_t)index1)))
                                + "\n---end of terminal node "
                                + std::to_string(node_rules.size() + (size_t)index1)
                                + "---\n");
        return;
    }

    
    std::string cond_left = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_left[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_left) : ((*hplanes)[curr_ix].hplane_left),
                        index1, cond_left, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
    cond_left.clear();
    std::string cond_right = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_right[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_right) : ((*hplanes)[curr_ix].hplane_right),
                        index1, cond_right, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
}